

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

TypeParameterSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool&,bool&,slang::ast::ForwardTypeRestriction&>
          (BumpAllocator *this,Scope *args,basic_string_view<char,_std::char_traits<char>_> *args_1,
          SourceLocation *args_2,bool *args_3,bool *args_4,ForwardTypeRestriction *args_5)

{
  string_view name;
  TypeParameterSymbol *this_00;
  
  this_00 = (TypeParameterSymbol *)allocate(this,0xa8,8);
  name._M_len = args_1->_M_len;
  name._M_str = args_1->_M_str;
  ast::TypeParameterSymbol::TypeParameterSymbol(this_00,args,name,*args_2,*args_3,*args_4,*args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }